

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O3

void zprint_lu_col(char *msg,int jcol,int pivrow,int_t *xprune,GlobalLU_t *Glu)

{
  int *piVar1;
  int *piVar2;
  int_t *piVar3;
  int_t *piVar4;
  void *pvVar5;
  int_t *piVar6;
  void *pvVar7;
  int_t *piVar8;
  int_t *piVar9;
  undefined4 in_register_00000014;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  piVar1 = Glu->xsup;
  piVar2 = Glu->supno;
  piVar3 = Glu->lsub;
  piVar4 = Glu->xlsub;
  pvVar5 = Glu->lusup;
  piVar6 = Glu->xlusup;
  pvVar7 = Glu->ucol;
  piVar8 = Glu->usub;
  piVar9 = Glu->xusub;
  printf("%s",msg,CONCAT44(in_register_00000014,pivrow));
  lVar10 = (long)jcol;
  printf("col %d: pivrow %d, supno %d, xprune %lld\n",jcol,(ulong)(uint)pivrow,
         (ulong)(uint)piVar2[lVar10],(long)xprune[lVar10]);
  puts("\tU-col:");
  lVar12 = (long)piVar9[lVar10];
  if (piVar9[lVar10] < piVar9[lVar10 + 1]) {
    puVar11 = (undefined8 *)((long)pvVar7 + lVar12 * 0x10 + 8);
    do {
      printf("\t%d%10.4f, %10.4f\n",puVar11[-1],*puVar11,(ulong)(uint)piVar8[lVar12]);
      lVar12 = lVar12 + 1;
      puVar11 = puVar11 + 2;
    } while (lVar12 < piVar9[lVar10 + 1]);
  }
  puts("\tL-col in rectangular snode:");
  lVar12 = (long)piVar1[piVar2[lVar10]];
  lVar14 = (long)piVar4[lVar12];
  if (piVar4[lVar12] < piVar4[lVar12 + 1]) {
    lVar13 = (long)piVar6[lVar10];
    puVar11 = (undefined8 *)((long)pvVar5 + lVar13 * 0x10 + 8);
    do {
      if (piVar6[lVar10 + 1] <= lVar13) break;
      printf("\t%d\t%10.4f, %10.4f\n",puVar11[-1],*puVar11,(ulong)(uint)piVar3[lVar14]);
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 1;
      puVar11 = puVar11 + 2;
    } while (lVar14 < piVar4[lVar12 + 1]);
  }
  fflush(_stdout);
  return;
}

Assistant:

void
zprint_lu_col(char *msg, int jcol, int pivrow, int_t *xprune, GlobalLU_t *Glu)
{
    int_t    i, k;
    int     *xsup, *supno, fsupc;
    int_t   *xlsub, *lsub;
    doublecomplex  *lusup;
    int_t   *xlusup;
    doublecomplex  *ucol;
    int_t   *usub, *xusub;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    ucol    = (doublecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    
    printf("%s", msg);
    printf("col %d: pivrow %d, supno %d, xprune %lld\n", 
	   jcol, pivrow, supno[jcol], (long long) xprune[jcol]);
    
    printf("\tU-col:\n");
    for (i = xusub[jcol]; i < xusub[jcol+1]; i++)
	printf("\t%d%10.4f, %10.4f\n", (int)usub[i], ucol[i].r, ucol[i].i);
    printf("\tL-col in rectangular snode:\n");
    fsupc = xsup[supno[jcol]];	/* first col of the snode */
    i = xlsub[fsupc];
    k = xlusup[jcol];
    while ( i < xlsub[fsupc+1] && k < xlusup[jcol+1] ) {
	printf("\t%d\t%10.4f, %10.4f\n", (int)lsub[i], lusup[k].r, lusup[k].i);
	i++; k++;
    }
    fflush(stdout);
}